

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O2

iterator __thiscall
FlatMap<int,_MyStruct,_std::less<int>_>::find
          (FlatMap<int,_MyStruct,_std::less<int>_> *this,int *key)

{
  __normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
  _Var1;
  __normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
  _Var2;
  
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<std::pair<int,MyStruct>*,std::vector<std::pair<int,MyStruct>,std::allocator<std::pair<int,MyStruct>>>>,int,__gnu_cxx::__ops::_Iter_comp_val<FlatMap<int,MyStruct,std::less<int>>::ValueToKeyComparator>>
                    ((this->vec_).
                     super__Vector_base<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->vec_).
                     super__Vector_base<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,key);
  _Var2._M_current =
       (this->vec_).
       super__Vector_base<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if ((_Var1._M_current != _Var2._M_current) && ((_Var1._M_current)->first <= *key)) {
    _Var2 = _Var1;
  }
  return (iterator)_Var2._M_current;
}

Assistant:

iterator find(const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.end();
        } else {
            return pos;
        }
    }